

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

scalar __thiscall
absl::make_unique<s2shapeutil::VectorShapeFactory,s2shapeutil::VectorShapeFactory_const&>
          (absl *this,VectorShapeFactory *args)

{
  VectorShapeFactory *this_00;
  
  this_00 = (VectorShapeFactory *)operator_new(0x18);
  s2shapeutil::VectorShapeFactory::VectorShapeFactory(this_00,args);
  *(VectorShapeFactory **)this = this_00;
  return (__uniq_ptr_data<s2shapeutil::VectorShapeFactory,_std::default_delete<s2shapeutil::VectorShapeFactory>,_true,_true>
          )(__uniq_ptr_data<s2shapeutil::VectorShapeFactory,_std::default_delete<s2shapeutil::VectorShapeFactory>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}